

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte.hpp
# Opt level: O0

byte nonstd::to_byte<int>(int v)

{
  byte b;
  int v_local;
  
  return (byte)(type)v;
}

Assistant:

inline byte_constexpr byte to_byte( IntegerType v ) byte_noexcept
{
#if   byte_HAVE_ENUM_CLASS_CONSTRUCTION_FROM_UNDERLYING_TYPE
    return static_cast<byte>( v );
#elif byte_HAVE_CONSTEXPR_11
    return { static_cast<typename byte::type>( v ) };
#else
    byte b = { static_cast<typename byte::type>( v ) }; return b;
#endif
}